

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O1

void __thiscall QItemSelectionModelPrivate::modelDestroyed(QItemSelectionModelPrivate *this)

{
  long lVar1;
  
  (this->model).super_QPropertyData<QAbstractItemModel_*>.val = (QAbstractItemModel *)0x0;
  lVar1 = 0;
  do {
    QObject::disconnect((Connection *)((long)&(this->connections)._M_elems[0].d_ptr + lVar1));
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x60);
  QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
  ::notify(&this->model);
  return;
}

Assistant:

void QItemSelectionModelPrivate::modelDestroyed()
{
    model.setValueBypassingBindings(nullptr);
    disconnectModel();
    model.notify();
}